

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestBuildHandler::GetMakeCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string configType;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string((string *)&configType,"MakeCommand",(allocator *)&local_1d0);
  cmCTest::GetCTestConfiguration(__return_storage_ptr__,pcVar1,&configType);
  std::__cxx11::string::~string((string *)&configType);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&configType);
  poVar3 = std::operator<<((ostream *)&configType,"MakeCommand:");
  poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
  std::operator<<(poVar3,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x123,local_1d0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configType);
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::string((string *)&configType,(string *)psVar4);
  bVar2 = std::operator==(&configType,"");
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string((string *)&local_1b0,"DefaultCTestConfigurationType",&local_1d1);
    cmCTest::GetCTestConfiguration(&local_1d0,pcVar1,&local_1b0);
    std::__cxx11::string::operator=((string *)&configType,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  bVar2 = std::operator==(&configType,"");
  if (bVar2) {
    std::__cxx11::string::assign((char *)&configType);
  }
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"${CTEST_CONFIGURATION_TYPE}",configType._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&configType);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBuildHandler::GetMakeCommand()
{
  std::string makeCommand
    = this->CTest->GetCTestConfiguration("MakeCommand");
  cmCTestOptionalLog(this->CTest,
    HANDLER_VERBOSE_OUTPUT, "MakeCommand:" << makeCommand << "\n",
    this->Quiet);

  std::string configType = this->CTest->GetConfigType();
  if (configType == "")
    {
    configType
      = this->CTest->GetCTestConfiguration("DefaultCTestConfigurationType");
    }
  if (configType == "")
    {
    configType = "Release";
    }

  cmSystemTools::ReplaceString(makeCommand,
    "${CTEST_CONFIGURATION_TYPE}", configType.c_str());

  return makeCommand;
}